

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O2

void predict_iforest(float *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,float *Xc,int *Xc_ind,int *Xc_indptr,float *Xr,int *Xr_ind,
                    int *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    int *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pSVar4;
  pointer puVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  ScoringMetric SVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  PredictionData<float,_int> *prediction_data;
  undefined7 uVar16;
  ExtIsoForest *pEVar17;
  int *piVar18;
  double *pdVar19;
  float *pfVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auStack_e8 [40];
  double dStack_c0;
  float *pfStack_b8;
  int iStack_ac;
  int *piStack_a8;
  undefined1 auStack_a0 [8];
  PredictionData<float,_int> PStack_98;
  
  if (nrows == 0) {
    return;
  }
  PStack_98.nrows = nrows;
  PStack_98.Xc_ind = Xc_ind;
  PStack_98.Xc_indptr = Xc_indptr;
  PStack_98.Xr = Xr;
  PStack_98.Xr_ind = Xr_ind;
  PStack_98.Xr_indptr = Xr_indptr;
  uVar13 = nrows & 0xffffffff;
  if ((ulong)(long)nthreads <= nrows) {
    uVar13 = (ulong)(uint)nthreads;
  }
  iStack_ac = (int)uVar13;
  prediction_data =
       (PredictionData<float,_int> *)CONCAT71((int7)(uVar13 >> 8),Xc_indptr != (int *)0x0);
  piStack_a8 = categ_data;
  PStack_98.numeric_data = numeric_data;
  PStack_98.categ_data = categ_data;
  PStack_98.is_col_major = is_col_major;
  PStack_98.ncols_numeric = ncols_numeric;
  PStack_98.ncols_categ = ncols_categ;
  PStack_98.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int *)0x0) {
    prediction_data = &PStack_98;
    batched_csc_predict<float,int>
              (prediction_data,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
LAB_001393d8:
    if (model_outputs != (IsoForest *)0x0) goto LAB_001393e9;
    lVar8 = (long)(model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = lVar8 / 0x18;
    auVar26._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar26._0_8_ = lVar14;
    auVar26._12_4_ = 0x45300000;
    auStack_e8._24_8_ = auVar26._8_8_ - 1.9342813113834067e+25;
    auStack_e8._16_8_ =
         (double)auStack_e8._24_8_ + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)
    ;
    dStack_c0 = model_outputs_ext->exp_avg_depth * (double)auStack_e8._16_8_;
    SVar11 = model_outputs_ext->scoring_metric;
    bVar21 = SVar11 == Density;
    bVar22 = SVar11 == BoxedRatio;
    uVar15 = (undefined4)CONCAT71((int7)((ulong)prediction_data >> 8),SVar11 == BoxedDensity);
    auStack_e8._12_4_ = (undefined4)CONCAT71((int7)((ulong)(lVar8 % 0x18) >> 8),1);
LAB_00139527:
    bVar23 = SVar11 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (int *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (int *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        if (nrows == 1 || !is_col_major) {
          auStack_e8._16_8_ = nrows * 4;
          lVar8 = 0;
          for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
            auStack_e8._0_8_ = (float *)0x0;
            lVar14 = 0;
            uVar13 = 0;
            piVar18 = tree_num;
            pdVar19 = per_tree_depths;
            while( true ) {
              prediction_data =
                   (PredictionData<float,_int> *)
                   (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                      0x18;
              if (uVar6 <= uVar13) break;
              piVar12 = piVar18;
              if (tree_num == (int *)0x0) {
                piVar12 = tree_num;
              }
              pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar7 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<float,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&prediction_data->numeric_data + lVar14),model_outputs_ext,
                         PStack_98.numeric_data + PStack_98.ncols_numeric * sVar9,
                         (double *)auStack_e8,piVar12,pdVar7,sVar9);
              uVar13 = uVar13 + 1;
              lVar14 = lVar14 + 0x18;
              pdVar19 = pdVar19 + 1;
              piVar18 = (int *)((long)piVar18 + auStack_e8._16_8_);
            }
            output_depths[sVar9] = (double)auStack_e8._0_8_;
            lVar8 = lVar8 + 8;
          }
        }
        else {
          auStack_e8._16_8_ = nrows * 4;
          lVar8 = 0;
          for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
            auStack_e8._0_8_ = (float *)0x0;
            lVar14 = 0;
            uVar13 = 0;
            piVar18 = tree_num;
            pdVar19 = per_tree_depths;
            while( true ) {
              prediction_data =
                   (PredictionData<float,_int> *)
                   (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                      0x18;
              if (uVar6 <= uVar13) break;
              piVar12 = piVar18;
              if (tree_num == (int *)0x0) {
                piVar12 = tree_num;
              }
              pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar7 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<float,int>,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&prediction_data->numeric_data + lVar14),model_outputs_ext,
                         &PStack_98,(double *)auStack_e8,piVar12,pdVar7,sVar9);
              uVar13 = uVar13 + 1;
              lVar14 = lVar14 + 0x18;
              pdVar19 = pdVar19 + 1;
              piVar18 = (int *)((long)piVar18 + auStack_e8._16_8_);
            }
            output_depths[sVar9] = (double)auStack_e8._0_8_;
            lVar8 = lVar8 + 8;
          }
        }
      }
      else {
        auStack_e8._16_8_ = nrows * 4;
        lVar8 = 0;
        for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
          auStack_e8._0_8_ = (float *)0x0;
          lVar14 = 0;
          uVar13 = 0;
          piVar18 = tree_num;
          pdVar19 = per_tree_depths;
          while( true ) {
            prediction_data =
                 (PredictionData<float,_int> *)
                 (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                    0x18;
            if (uVar6 <= uVar13) break;
            piVar12 = piVar18;
            if (tree_num == (int *)0x0) {
              piVar12 = tree_num;
            }
            pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
            if (per_tree_depths == (double *)0x0) {
              pdVar7 = (double *)0x0;
            }
            traverse_hplane<PredictionData<float,int>,int,ImputedData<int,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&prediction_data->numeric_data + lVar14),model_outputs_ext,&PStack_98,
                       (double *)auStack_e8,(vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<int,_double> *)0x0,piVar12,pdVar7,sVar9);
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x18;
            pdVar19 = pdVar19 + 1;
            piVar18 = (int *)((long)piVar18 + auStack_e8._16_8_);
          }
          output_depths[sVar9] = (double)auStack_e8._0_8_;
          lVar8 = lVar8 + 8;
        }
      }
      goto LAB_001393d8;
    }
    if (model_outputs->missing_action != Fail) {
LAB_0013925a:
      auStack_e8._0_8_ = (float *)0x0;
      dStack_c0 = (double)(nrows * 4);
      lVar8 = 0;
      pfVar20 = (float *)0x0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        if (((ulong)pfVar20 & 1) == 0) {
          dVar24 = 0.0;
          lVar14 = 0;
          uVar13 = 0;
          piVar18 = tree_num;
          pdVar19 = per_tree_depths;
          pfStack_b8 = pfVar20;
          while( true ) {
            pvVar1 = (model_outputs->trees).
                     super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
            if (uVar6 <= uVar13) break;
            piVar12 = piVar18;
            if (tree_num == (int *)0x0) {
              piVar12 = tree_num;
            }
            pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
            if (per_tree_depths == (double *)0x0) {
              pdVar7 = (double *)0x0;
            }
            auStack_e8._16_8_ = dVar24;
            dVar24 = traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar1->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar14),model_outputs,&PStack_98,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<int,_double> *)0x0,0.0,sVar9,piVar12,pdVar7,0);
            dVar24 = (double)auStack_e8._16_8_ + dVar24;
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x18;
            pdVar19 = pdVar19 + 1;
            piVar18 = (int *)((long)piVar18 + (long)dStack_c0);
          }
          output_depths[sVar9] = dVar24;
          pfVar20 = pfStack_b8;
        }
        lVar8 = lVar8 + 8;
      }
      if (((ulong)pfVar20 & 1) != 0) {
        std::__exception_ptr::exception_ptr::exception_ptr
                  ((exception_ptr *)auStack_a0,(exception_ptr *)auStack_e8);
        uVar10 = std::rethrow_exception((exception_ptr)auStack_a0);
        std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)auStack_e8);
        _Unwind_Resume(uVar10);
      }
      prediction_data = (PredictionData<float,_int> *)auStack_e8;
      std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)prediction_data);
      goto LAB_001393d8;
    }
    if (model_outputs->new_cat_action == Weighted) {
      bVar21 = model_outputs->cat_split_type == SingleCateg;
      if (((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) &&
         (prediction_data =
               (PredictionData<float,_int> *)CONCAT71((int7)((ulong)model_outputs >> 8),bVar21),
         categ_data == (int *)0x0 || bVar21)) goto LAB_00139a9c;
      goto LAB_0013925a;
    }
    prediction_data = (PredictionData<float,_int> *)model_outputs;
    if (Xc_indptr != (int *)0x0 || Xr_indptr != (int *)0x0) goto LAB_0013925a;
LAB_00139a9c:
    if (model_outputs->has_range_penalty != false) goto LAB_0013925a;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      auStack_e8._16_8_ = nrows * 4;
      lVar8 = 0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        auStack_e8._0_8_ = (float *)0x0;
        lVar14 = 0;
        uVar13 = 0;
        piVar18 = tree_num;
        pdVar19 = per_tree_depths;
        while( true ) {
          prediction_data =
               (PredictionData<float,_int> *)
               (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) / 0x18;
          if (uVar6 <= uVar13) break;
          piVar12 = piVar18;
          if (tree_num == (int *)0x0) {
            piVar12 = tree_num;
          }
          pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
          if (per_tree_depths == (double *)0x0) {
            pdVar7 = (double *)0x0;
          }
          traverse_itree_fast<float,int>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&prediction_data->numeric_data + lVar14),model_outputs,
                     PStack_98.numeric_data + PStack_98.ncols_numeric * sVar9,(double *)auStack_e8,
                     piVar12,pdVar7,sVar9);
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x18;
          pdVar19 = pdVar19 + 1;
          piVar18 = (int *)((long)piVar18 + auStack_e8._16_8_);
        }
        output_depths[sVar9] = (double)auStack_e8._0_8_;
        lVar8 = lVar8 + 8;
      }
    }
    else {
      auStack_e8._16_8_ = nrows * 4;
      lVar8 = 0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        auStack_e8._0_8_ = (float *)0x0;
        lVar14 = 0;
        uVar13 = 0;
        piVar18 = tree_num;
        pdVar19 = per_tree_depths;
        while( true ) {
          prediction_data =
               (PredictionData<float,_int> *)
               (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) / 0x18;
          if (uVar6 <= uVar13) break;
          piVar12 = piVar18;
          if (tree_num == (int *)0x0) {
            piVar12 = tree_num;
          }
          pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar19);
          if (per_tree_depths == (double *)0x0) {
            pdVar7 = (double *)0x0;
          }
          traverse_itree_no_recurse<PredictionData<float,int>,int>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&prediction_data->numeric_data + lVar14),model_outputs,&PStack_98,
                     (double *)auStack_e8,piVar12,pdVar7,sVar9);
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x18;
          pdVar19 = pdVar19 + 1;
          piVar18 = (int *)((long)piVar18 + auStack_e8._16_8_);
        }
        output_depths[sVar9] = (double)auStack_e8._0_8_;
        lVar8 = lVar8 + 8;
      }
    }
LAB_001393e9:
    lVar8 = ((long)(model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    auVar25._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar25._0_8_ = lVar8;
    auVar25._12_4_ = 0x45300000;
    auStack_e8._24_8_ = auVar25._8_8_ - 1.9342813113834067e+25;
    auStack_e8._16_8_ =
         (double)auStack_e8._24_8_ + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dStack_c0 = model_outputs->exp_avg_depth * (double)auStack_e8._16_8_;
    SVar11 = model_outputs->scoring_metric;
    bVar21 = SVar11 == Density;
    uVar16 = (undefined7)((ulong)prediction_data >> 8);
    if (bVar21) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar22 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar21 = true;
LAB_00139514:
        uVar15 = (undefined4)CONCAT71(uVar16,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_0013951c:
        SVar11 = model_outputs_ext->scoring_metric;
        auStack_e8._12_4_ = 0;
        goto LAB_00139527;
      }
      bVar22 = false;
LAB_00139676:
      bVar23 = SVar11 == BoxedDensity2;
      uVar15 = 0;
LAB_0013967f:
      auStack_e8._12_4_ = 0;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar21 = model_outputs_ext->scoring_metric == Density;
        bVar22 = true;
        if (SVar11 == BoxedRatio) goto LAB_00139514;
        bVar22 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar15 = (undefined4)CONCAT71(uVar16,1);
        if ((SVar11 == BoxedDensity) ||
           (uVar15 = (undefined4)CONCAT71(uVar16,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar11 != BoxedDensity2)) goto LAB_0013951c;
        bVar23 = true;
        goto LAB_0013967f;
      }
      bVar22 = SVar11 == BoxedRatio;
      if (SVar11 != BoxedDensity) goto LAB_00139676;
      uVar15 = (undefined4)CONCAT71(uVar16,1);
      bVar21 = false;
      auStack_e8._12_4_ = 0;
      bVar23 = false;
    }
  }
  pfStack_b8 = (float *)CONCAT44(pfStack_b8._4_4_,uVar15);
  if (standardize) {
    if (bVar21 || bVar23) {
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        output_depths[sVar9] = output_depths[sVar9] / -(double)auStack_e8._16_8_;
      }
    }
    else if ((char)uVar15 == '\0') {
      if (bVar22) {
        for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
          output_depths[sVar9] = output_depths[sVar9] / (double)auStack_e8._16_8_;
        }
      }
      else {
        for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
          dVar24 = exp2(-output_depths[sVar9] / dStack_c0);
          output_depths[sVar9] = dVar24;
        }
      }
    }
    else {
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        dVar24 = exp(output_depths[sVar9] / (double)auStack_e8._16_8_);
        output_depths[sVar9] = -dVar24;
      }
    }
  }
  else if ((bVar21 || (char)uVar15 != '\0') || bVar23) {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      dVar24 = exp(output_depths[sVar9] / (double)auStack_e8._16_8_);
      output_depths[sVar9] = dVar24;
    }
  }
  else if (bVar22) {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      output_depths[sVar9] = output_depths[sVar9] / -(double)auStack_e8._16_8_;
    }
  }
  else {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      output_depths[sVar9] = output_depths[sVar9] / (double)auStack_e8._16_8_;
    }
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar21 || ((ulong)pfStack_b8 & 1) != 0) || bVar23)) {
    pEVar17 = (ExtIsoForest *)model_outputs;
    if (auStack_e8[0xc] != '\0') {
      pEVar17 = model_outputs_ext;
    }
    pvVar2 = (pEVar17->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (pEVar17->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; (((long)pvVar2 - (long)pvVar3) / 0x18) * nrows - lVar8 != 0; lVar8 = lVar8 + 1)
    {
      dVar24 = exp(per_tree_depths[lVar8]);
      per_tree_depths[lVar8] = dVar24;
    }
  }
  if (tree_num == (int *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar4 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar4 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_00139900:
    remap_terminal_trees<PredictionData<float,int>,int>
              (model_outputs,model_outputs_ext,&PStack_98,tree_num,iStack_ac);
  }
  else {
    if (auStack_e8[0xc] == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar8 = (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (piStack_a8 != (int *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_00139900;
    }
    else {
      lVar8 = (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    for (lVar14 = 0; lVar14 != lVar8 / 0x18; lVar14 = lVar14 + 1) {
      puVar5 = pSVar4[lVar14].terminal_node_mappings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        tree_num[sVar9] = (int)puVar5[tree_num[sVar9]];
      }
      tree_num = tree_num + nrows;
    }
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}